

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O2

tuple<int,_int>
find_i_jNANS(vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *buff)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int in_EDX;
  undefined8 *in_RSI;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  piVar2 = (int *)*in_RSI;
  uVar4 = in_RSI[1] - (long)piVar2 >> 3;
  if ((1 < uVar4) && (in_EDX = piVar2[1], in_EDX == piVar2[3])) {
    in_EDX = piVar2[5];
  }
  iVar1 = *piVar2;
  uVar5 = 1;
  do {
    iVar6 = iVar1;
    if (uVar4 <= uVar5) break;
    iVar6 = piVar2[uVar5 * 2];
    if (iVar1 == iVar6) {
      iVar6 = piVar2[(uVar5 & 0xffffffff) * 2 + 2];
      break;
    }
    lVar3 = uVar5 * 2;
    uVar5 = uVar5 + 1;
  } while (iVar1 != piVar2[lVar3 + 2]);
  *(int *)&(buff->super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start = iVar6;
  *(int *)((long)&(buff->
                  super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start + 4) = in_EDX;
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)buff;
}

Assistant:

std::tuple<int,int> find_i_jNANS (std::vector<std::tuple<int,int>> &buff){
    int tmp,tmp2;
    auto p = std::get<0>(buff[0]);
    for(int i = 1; i<buff.size(); i++){
        if(p==std::get<0>(buff[i])){
            tmp = std::get<0>(buff[i+1]);
            break;
        }
        else if(i){tmp = p; break;}
    }

    auto w = std::get<1>(buff[0]);
    for(int i = 1; i<buff.size(); i++){
        if(w==std::get<1>(buff[i])){
            tmp2 = std::get<1>(buff[i+1]);
            break;
        }
        else if(w==std::get<1>(buff[i+1])){
            tmp2 = std::get<1>(buff[i]);
            break;
        }
        else {tmp2 = w;}
    }
    return std::make_tuple(tmp,tmp2);
}